

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

float * stbi_loadf_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi_uc *data_00;
  int local_54;
  uchar *data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  FILE *f_local;
  
  iVar1 = stbi_hdr_test_file(f);
  if (iVar1 == 0) {
    data_00 = stbi_load_from_file(f,x,y,comp,req_comp);
    if (data_00 == (stbi_uc *)0x0) {
      e("Image not of any known type, or corrupt");
      f_local = (FILE *)0x0;
    }
    else {
      local_54 = req_comp;
      if (req_comp == 0) {
        local_54 = *comp;
      }
      f_local = (FILE *)ldr_to_hdr(data_00,*x,*y,local_54);
    }
  }
  else {
    f_local = (FILE *)stbi_hdr_load_from_file(f,x,y,comp,req_comp);
  }
  return (float *)f_local;
}

Assistant:

float *stbi_loadf_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_file(f))
      return stbi_hdr_load_from_file(f,x,y,comp,req_comp);
   #endif
   data = stbi_load_from_file(f, x, y, comp, req_comp);
   if (data)
      return ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return epf("unknown image type", "Image not of any known type, or corrupt");
}